

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::applyClusters(btSoftBody *this,bool drift)

{
  float fVar1;
  Cluster *pCVar2;
  Node *pNVar3;
  Node *pNVar4;
  undefined1 auVar5 [16];
  int j;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  btVector3 bVar11;
  btVector3 bVar12;
  CProfileSample __profile;
  btVector3 w;
  long local_e8;
  long local_e0;
  btAlignedObjectArray<float> weights;
  btAlignedObjectArray<btVector3> deltas;
  float local_78;
  float local_68;
  float fStack_64;
  btVector3 local_50;
  btVector3 local_40;
  
  CProfileManager::Start_Profile("ApplyClusters");
  deltas.m_ownsMemory = true;
  deltas.m_data = (btVector3 *)0x0;
  deltas.m_size = 0;
  deltas.m_capacity = 0;
  weights.m_ownsMemory = true;
  weights.m_data = (float *)0x0;
  weights.m_size = 0;
  weights.m_capacity = 0;
  w.m_floats = (btScalar  [4])ZEXT816(0);
  btAlignedObjectArray<btVector3>::resize(&deltas,(this->m_nodes).m_size,&w);
  auVar5._12_4_ = 0;
  auVar5._0_4_ = w.m_floats[1];
  auVar5._4_4_ = w.m_floats[2];
  auVar5._8_4_ = w.m_floats[3];
  w.m_floats = (btScalar  [4])(auVar5 << 0x20);
  btAlignedObjectArray<float>::resize(&weights,(this->m_nodes).m_size,w.m_floats);
  if (drift) {
    for (lVar6 = 0; lVar6 < (this->m_clusters).m_size; lVar6 = lVar6 + 1) {
      pCVar2 = (this->m_clusters).m_data[lVar6];
      if (pCVar2->m_ndimpulses != 0) {
        w.m_floats[0] = (float)pCVar2->m_ndimpulses;
        btVector3::operator/=(pCVar2->m_dimpulses,w.m_floats);
        w.m_floats[0] = (float)pCVar2->m_ndimpulses;
        btVector3::operator/=(pCVar2->m_dimpulses + 1,w.m_floats);
      }
    }
    local_e0 = 0x15c;
    local_e8 = 0x138;
    lVar6 = 0x148;
  }
  else {
    local_e0 = 0x158;
    local_e8 = 0x118;
    lVar6 = 0x128;
  }
  for (lVar8 = 0; lVar8 < (this->m_clusters).m_size; lVar8 = lVar8 + 1) {
    pCVar2 = (this->m_clusters).m_data[lVar8];
    if (0 < *(int *)((long)(&(pCVar2->m_framexform).m_basis + -2) + local_e0)) {
      bVar11 = operator*((btVector3 *)((long)(&(pCVar2->m_framexform).m_basis + -2) + local_e8),
                         &(this->m_sst).sdt);
      w = operator*((btVector3 *)((long)(&(pCVar2->m_framexform).m_basis + -2) + lVar6),
                    &(this->m_sst).sdt);
      for (lVar7 = 0; lVar7 < (pCVar2->m_nodes).m_size; lVar7 = lVar7 + 1) {
        pNVar3 = (pCVar2->m_nodes).m_data[lVar7];
        pNVar4 = (this->m_nodes).m_data;
        fVar1 = (pCVar2->m_masses).m_data[lVar7];
        local_50 = operator-(&pNVar3->m_x,&pCVar2->m_com);
        bVar12 = btVector3::cross(&w,&local_50);
        local_78 = bVar11.m_floats[2];
        local_68 = bVar11.m_floats[0];
        fStack_64 = bVar11.m_floats[1];
        local_40.m_floats[1] = fVar1 * (bVar12.m_floats[1] + fStack_64);
        local_40.m_floats[0] = fVar1 * (bVar12.m_floats[0] + local_68);
        local_40.m_floats[2] = (bVar12.m_floats[2] + local_78) * fVar1;
        local_40.m_floats[3] = 0.0;
        iVar10 = (int)(((long)pNVar3 - (long)pNVar4) / 0x78);
        btVector3::operator+=(deltas.m_data + iVar10,&local_40);
        weights.m_data[iVar10] = fVar1 + weights.m_data[iVar10];
      }
    }
  }
  lVar6 = 0x10;
  lVar7 = 0;
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < deltas.m_size; lVar8 = lVar8 + 1) {
    if (0.0 < *(float *)((long)weights.m_data + lVar7)) {
      w = operator/((btVector3 *)((long)(deltas.m_data)->m_floats + lVar9),
                    (btScalar *)((long)weights.m_data + lVar7));
      btVector3::operator+=
                ((btVector3 *)
                 ((long)&(((Node *)(&((this->m_nodes).m_data)->m_x + -1))->super_Feature).
                         super_Element.m_tag + lVar6),&w);
    }
    lVar9 = lVar9 + 0x10;
    lVar7 = lVar7 + 4;
    lVar6 = lVar6 + 0x78;
  }
  btAlignedObjectArray<float>::~btAlignedObjectArray(&weights);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&deltas);
  CProfileSample::~CProfileSample(&__profile);
  return;
}

Assistant:

void					btSoftBody::applyClusters(bool drift)
{
	BT_PROFILE("ApplyClusters");
//	const btScalar					f0=m_sst.sdt;
	//const btScalar					f1=f0/2;
	btAlignedObjectArray<btVector3> deltas;
	btAlignedObjectArray<btScalar> weights;
	deltas.resize(m_nodes.size(),btVector3(0,0,0));
	weights.resize(m_nodes.size(),0);
	int i;

	if(drift)
	{
		for(i=0;i<m_clusters.size();++i)
		{
			Cluster&	c=*m_clusters[i];
			if(c.m_ndimpulses)
			{
				c.m_dimpulses[0]/=(btScalar)c.m_ndimpulses;
				c.m_dimpulses[1]/=(btScalar)c.m_ndimpulses;
			}
		}
	}
	
	for(i=0;i<m_clusters.size();++i)
	{
		Cluster&	c=*m_clusters[i];	
		if(0<(drift?c.m_ndimpulses:c.m_nvimpulses))
		{
			const btVector3		v=(drift?c.m_dimpulses[0]:c.m_vimpulses[0])*m_sst.sdt;
			const btVector3		w=(drift?c.m_dimpulses[1]:c.m_vimpulses[1])*m_sst.sdt;
			for(int j=0;j<c.m_nodes.size();++j)
			{
				const int			idx=int(c.m_nodes[j]-&m_nodes[0]);
				const btVector3&	x=c.m_nodes[j]->m_x;
				const btScalar		q=c.m_masses[j];
				deltas[idx]		+=	(v+btCross(w,x-c.m_com))*q;
				weights[idx]	+=	q;
			}
		}
	}
	for(i=0;i<deltas.size();++i)
	{
		if(weights[i]>0) 
		{
			m_nodes[i].m_x+=deltas[i]/weights[i];
		}
	}
}